

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstract.c
# Opt level: O2

ErrorNumber callAndProfile(char *funcName,ProfilingType type)

{
  TA_Real *value;
  TA_Integer TVar1;
  TA_InputParameterType TVar2;
  uint uVar3;
  TA_RetCode TVar4;
  ErrorNumber EVar5;
  long lVar6;
  ulong uVar7;
  TA_Real *volume;
  clock_t cVar8;
  clock_t cVar9;
  uint uVar10;
  TA_Real *high;
  int iVar12;
  TA_Real *open;
  int (*paiVar13) [2000];
  double (*padVar14) [2000];
  uint uVar15;
  char *__s;
  TA_Real *low;
  TA_Real *close;
  long lVar16;
  ulong uVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  TA_ParamHolder *paramHolder;
  int local_9c;
  TA_FuncHandle *handle;
  int local_8c;
  int local_88;
  TA_Integer local_84;
  ulong local_80;
  TA_FuncInfo *funcInfo;
  ulong local_70;
  long local_68;
  ulong local_60;
  double local_58;
  double local_50;
  TA_OutputParameterInfo *outputInfo;
  TA_InputParameterInfo *inputInfo;
  int outNbElement;
  int outBegIdx;
  ulong uVar11;
  
  lVar6 = (long)(int)type;
  uVar10 = *(uint *)(&DAT_00182660 + lVar6 * 4);
  iVar12 = *(int *)(&DAT_0018267c + lVar6 * 4);
  lVar16 = *(long *)(&DAT_00182698 + lVar6 * 8);
  TVar1 = *(TA_Integer *)(&DAT_001826d0 + lVar6 * 4);
  TVar4 = TA_GetFuncHandle(funcName,&handle);
  if (TVar4 == TA_SUCCESS) {
    TVar4 = TA_ParamHolderAlloc(handle,&paramHolder);
    if (TVar4 == TA_SUCCESS) {
      local_9c = iVar12;
      local_84 = TVar1;
      local_80 = (ulong)uVar10;
      local_68 = lVar16;
      TA_GetFuncInfo(handle,&funcInfo);
      paiVar13 = output_int;
      padVar14 = output;
      for (lVar16 = 0; lVar16 < (int)funcInfo->nbOutput; lVar16 = lVar16 + 1) {
        uVar10 = (uint)lVar16;
        TA_GetOutputParameterInfo(handle,uVar10,&outputInfo);
        if (outputInfo->type == TA_Output_Integer) {
          TA_SetOutputParamIntegerPtr(paramHolder,uVar10,output_int[lVar16]);
          for (lVar6 = 0; lVar6 != 2000; lVar6 = lVar6 + 1) {
            (*paiVar13)[lVar6] = -0x7fffffff;
          }
        }
        else if (outputInfo->type == TA_Output_Real) {
          TA_SetOutputParamRealPtr(paramHolder,uVar10,output[lVar16]);
          for (lVar6 = 0; lVar6 != 2000; lVar6 = lVar6 + 1) {
            (*padVar14)[lVar6] = -3e+37;
          }
        }
        paiVar13 = paiVar13 + 1;
        padVar14 = padVar14 + 1;
      }
      local_8c = local_9c * (int)local_80 * 2;
      dVar18 = 0.0;
      dVar20 = 0.0;
      uVar10 = 0;
      uVar7 = local_80;
      while (uVar11 = (ulong)uVar10, uVar10 != 2) {
        iVar12 = 0;
        local_70 = uVar11;
        while (iVar12 != local_9c) {
          uVar17 = 0;
          local_88 = iVar12;
          while (uVar17 != uVar7) {
            lVar16 = uVar17 * local_68;
            value = gDataClose + lVar16;
            local_60 = uVar17;
            local_58 = dVar20;
            local_50 = dVar18;
            for (uVar10 = 0; (int)uVar10 < (int)funcInfo->nbInput; uVar10 = uVar10 + 1) {
              uVar15 = uVar10;
              TA_GetInputParameterInfo(handle,uVar10,&inputInfo);
              TVar2 = inputInfo->type;
              if (TVar2 == TA_Input_Price) {
                uVar3 = inputInfo->flags;
                open = (TA_Real *)0x0;
                if ((uVar3 & 1) != 0) {
                  open = gDataOpen + lVar16;
                }
                auVar19._0_4_ = -(uint)((uVar3 & 0x10) == 0);
                auVar19._4_4_ = -(uint)((uVar3 & 8) == 0);
                auVar19._8_4_ = -(uint)((uVar3 & 4) == 0);
                auVar19._12_4_ = -(uint)((uVar3 & 2) == 0);
                uVar15 = movmskps(uVar15,auVar19);
                high = (TA_Real *)0x0;
                if ((uVar15 & 8) == 0) {
                  high = gDataHigh + lVar16;
                }
                low = (TA_Real *)0x0;
                if ((uVar15 & 4) == 0) {
                  low = gDataLow + lVar16;
                }
                close = (TA_Real *)0x0;
                if ((uVar15 & 2) == 0) {
                  close = value;
                }
                volume = (TA_Real *)0x0;
                if ((uVar15 & 1) == 0) {
                  volume = value;
                }
                TA_SetInputParamPricePtr
                          (paramHolder,uVar10,open,high,low,close,volume,(TA_Real *)0x0);
              }
              else if (TVar2 == TA_Input_Real) {
                TA_SetInputParamRealPtr(paramHolder,uVar10,value);
              }
              else if (TVar2 == TA_Input_Integer) {
                __s = "\nError: Integer input not yet supported for profiling.";
                goto LAB_0011e46c;
              }
            }
            cVar8 = clock();
            TVar4 = TA_CallFunc(paramHolder,0,local_84,&outBegIdx,&outNbElement);
            if (TVar4 != TA_SUCCESS) {
              printf("TA_CallFunc() failed zero data test [%d]\n",(ulong)TVar4);
              TA_ParamHolderFree(paramHolder);
              return TA_ABS_TST_FAIL_CALLFUNC_1;
            }
            cVar9 = clock();
            if (cVar9 - cVar8 < 1) {
              __s = "Error: Insufficient timer precision to perform benchmarking on this platform.";
LAB_0011e46c:
              puts(__s);
              return TA_ABS_TST_FAIL_CALLFUNC_1;
            }
            dVar20 = (double)(cVar9 - cVar8);
            if (worstProfiledCall < dVar20) {
              worstProfiledCall = dVar20;
            }
            timeInProfiledCall = timeInProfiledCall + dVar20;
            nbProfiledCall = nbProfiledCall + 1;
            dVar18 = local_50 + dVar20;
            if (dVar20 <= local_58) {
              dVar20 = local_58;
            }
            uVar7 = local_80;
            uVar11 = local_70;
            uVar17 = local_60 + 1;
          }
          iVar12 = local_88 + 1;
        }
        uVar10 = (int)uVar11 + 1;
      }
      printf("%g ",(dVar18 - dVar20) / (double)(local_8c + -1));
      TVar4 = TA_ParamHolderFree(paramHolder);
      if (TVar4 == TA_SUCCESS) {
        EVar5 = TA_TEST_PASS;
      }
      else {
        printf("TA_ParamHolderFree failed [%d]\n",(ulong)TVar4);
        EVar5 = TA_ABS_TST_FAIL_PARAMHOLDERFREE;
      }
    }
    else {
      printf("Can\'t allocate the param holder [%d]\n",(ulong)TVar4);
      EVar5 = TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
    }
  }
  else {
    printf("Can\'t get the function handle [%d]\n",(ulong)TVar4);
    EVar5 = TA_ABS_TST_FAIL_GETFUNCHANDLE;
  }
  return EVar5;
}

Assistant:

static ErrorNumber callAndProfile( const char *funcName, ProfilingType type )
{
   TA_ParamHolder *paramHolder;
   const TA_FuncHandle *handle;
   const TA_FuncInfo *funcInfo;
   const TA_InputParameterInfo *inputInfo;
   const TA_OutputParameterInfo *outputInfo;

   TA_RetCode retCode;
   int h, i, j, k;
   int outBegIdx, outNbElement;

   /* Variables to control iteration and corresponding input size */
   int nbInnerLoop, nbOuterLoop;
   int stepSize;
   int inputSize;

   /* Variables measuring the execution time */
#ifdef WIN32
   LARGE_INTEGER startClock;
   LARGE_INTEGER endClock;
#else
   clock_t startClock;
   clock_t endClock;
#endif
   double clockDelta;
   int nbProfiledCallLocal;
   double timeInProfiledCallLocal;
   double worstProfiledCallLocal;

   nbProfiledCallLocal = 0;
   timeInProfiledCallLocal = 0.0;
   worstProfiledCallLocal = 0.0;
   nbInnerLoop = nbOuterLoop = stepSize = inputSize = 0;

   switch( type )
   {
   case PROFILING_10000:
	   nbInnerLoop = 1;
	   nbOuterLoop = 100;
	   stepSize = 10000;
	   inputSize = 10000;
	   break;
   case PROFILING_8000:
	   nbInnerLoop = 2;
	   nbOuterLoop = 50;
	   stepSize = 2000;
	   inputSize = 8000;
       break;
   case PROFILING_5000:
	   nbInnerLoop = 2;
	   nbOuterLoop = 50;
	   stepSize = 5000;
	   inputSize = 5000;
	   break;
   case PROFILING_2000:
	   nbInnerLoop = 5;
	   nbOuterLoop = 20;
	   stepSize = 2000;
	   inputSize = 2000;
	   break;
   case PROFILING_1000:
	   nbInnerLoop = 10;
	   nbOuterLoop = 10;
	   stepSize = 1000;
	   inputSize = 1000;
	   break;
   case PROFILING_500:
	   nbInnerLoop = 20;
	   nbOuterLoop = 5;
	   stepSize = 500;
	   inputSize = 500;
	   break;
   case PROFILING_100:
	   nbInnerLoop = 100;
	   nbOuterLoop = 1;
	   stepSize = 100;
	   inputSize = 100;
	   break;
   }

   retCode = TA_GetFuncHandle( funcName, &handle );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't get the function handle [%d]\n", retCode );
      return TA_ABS_TST_FAIL_GETFUNCHANDLE;
   }

   retCode = TA_ParamHolderAlloc( handle, &paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "Can't allocate the param holder [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERALLOC;
   }

   TA_GetFuncInfo( handle, &funcInfo );

   for( i=0; i < (int)funcInfo->nbOutput; i++ )
   {
      TA_GetOutputParameterInfo( handle, i, &outputInfo );
	  switch(outputInfo->type)
	  {
	  case TA_Output_Real:
	     TA_SetOutputParamRealPtr(paramHolder,i,&output[i][0]);
         for( j=0; j < 2000; j++ )
            output[i][j] = TA_REAL_MIN;
		 break;
	  case TA_Output_Integer:
	     TA_SetOutputParamIntegerPtr(paramHolder,i,&output_int[i][0]);
         for( j=0; j < 2000; j++ )
            output_int[i][j] = TA_INTEGER_MIN;
		 break;
	  }
   }

   for( h=0; h < 2; h++ )
   {
   for( i=0; i < nbOuterLoop; i++ )
   {
	   for( j=0; j < nbInnerLoop; j++ )
	   {
		   /* Prepare input. */
		   for( k=0; k < (int)funcInfo->nbInput; k++ )
		   {
			  TA_GetInputParameterInfo( handle, k, &inputInfo );
			  switch(inputInfo->type)
			  {
			  case TA_Input_Price:
				 TA_SetInputParamPricePtr( paramHolder, k,
					 inputInfo->flags&TA_IN_PRICE_OPEN?&gDataOpen[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_HIGH?&gDataHigh[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_LOW?&gDataLow[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_CLOSE?&gDataClose[j*stepSize]:NULL,
					 inputInfo->flags&TA_IN_PRICE_VOLUME?&gDataClose[j*stepSize]:NULL, NULL );
				 break;
			  case TA_Input_Real:
				 TA_SetInputParamRealPtr( paramHolder, k, &gDataClose[j*stepSize] );
				 break;
			  case TA_Input_Integer:
				 printf( "\nError: Integer input not yet supported for profiling.\n" );
				 return TA_ABS_TST_FAIL_CALLFUNC_1;
			  }
		   }

           #ifdef WIN32
              QueryPerformanceCounter(&startClock);
           #else
              startClock = clock();
           #endif

		   /* Do the function call. */
		   retCode = TA_CallFunc(paramHolder,0,inputSize-1,&outBegIdx,&outNbElement);
		   if( retCode != TA_SUCCESS )
		   {
		      printf( "TA_CallFunc() failed zero data test [%d]\n", retCode );
		      TA_ParamHolderFree( paramHolder );
		      return TA_ABS_TST_FAIL_CALLFUNC_1;
		   }

		   #ifdef WIN32
			   QueryPerformanceCounter(&endClock);
			   clockDelta = (double)((__int64)endClock.QuadPart - (__int64) startClock.QuadPart);
		   #else
			   endClock = clock();
			   clockDelta = (double)(endClock - startClock);
		   #endif

		   /* Setup global profiling info. */
		   if( clockDelta <= 0 )
		   {
			   printf( "Error: Insufficient timer precision to perform benchmarking on this platform.\n" );
			   return TA_ABS_TST_FAIL_CALLFUNC_1;
		   }
		   else
		   {
			   if( clockDelta > worstProfiledCall )
			      worstProfiledCall = clockDelta;
			   timeInProfiledCall += clockDelta;
			   nbProfiledCall++;
		   }

		   /* Setup local profiling info for this particular function. */
		   if( clockDelta > worstProfiledCallLocal )
			   worstProfiledCallLocal = clockDelta;
		   timeInProfiledCallLocal += clockDelta;
		   nbProfiledCallLocal++;
	   }
   }
   }

   /* Output statistic (remove worst call, average the others. */
   printf( "%g ", (timeInProfiledCallLocal-worstProfiledCallLocal)/(double)(nbProfiledCallLocal-1));

   retCode = TA_ParamHolderFree( paramHolder );
   if( retCode != TA_SUCCESS )
   {
      printf( "TA_ParamHolderFree failed [%d]\n", retCode );
      return TA_ABS_TST_FAIL_PARAMHOLDERFREE;
   }

   return TA_TEST_PASS;
}